

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::FamilyTest_counter_value_Test::~FamilyTest_counter_value_Test
          (FamilyTest_counter_value_Test *this)

{
  FamilyTest_counter_value_Test *this_local;
  
  ~FamilyTest_counter_value_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(FamilyTest, counter_value) {
  Family<Counter> family{"total_requests", "Counts all requests", {}};
  auto& counter = family.Add({});
  counter.Increment();
  auto collected = family.Collect();
  ASSERT_GE(collected.size(), 1U);
  ASSERT_GE(collected[0].metric.size(), 1U);
  EXPECT_EQ(1, collected[0].metric.at(0).counter.value);
}